

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void ra_append_copy(roaring_array_t *ra,roaring_array_t *sa,uint16_t index,_Bool copy_on_write)

{
  int iVar1;
  container_t *pcVar2;
  int32_t pos;
  _Bool copy_on_write_local;
  uint16_t index_local;
  roaring_array_t *sa_local;
  roaring_array_t *ra_local;
  
  extend_array(ra,1);
  iVar1 = ra->size;
  ra->keys[iVar1] = sa->keys[index];
  if (copy_on_write) {
    pcVar2 = get_copy_of_container(sa->containers[index],sa->typecodes + index,copy_on_write);
    sa->containers[index] = pcVar2;
    ra->containers[iVar1] = sa->containers[index];
    ra->typecodes[iVar1] = sa->typecodes[index];
  }
  else {
    pcVar2 = container_clone(sa->containers[index],sa->typecodes[index]);
    ra->containers[iVar1] = pcVar2;
    ra->typecodes[iVar1] = sa->typecodes[index];
  }
  ra->size = ra->size + 1;
  return;
}

Assistant:

void ra_append_copy(roaring_array_t *ra, const roaring_array_t *sa,
                    uint16_t index, bool copy_on_write) {
    extend_array(ra, 1);
    const int32_t pos = ra->size;

    // old contents is junk not needing freeing
    ra->keys[pos] = sa->keys[index];
    // the shared container will be in two bitmaps
    if (copy_on_write) {
        sa->containers[index] = get_copy_of_container(
            sa->containers[index], &sa->typecodes[index], copy_on_write);
        ra->containers[pos] = sa->containers[index];
        ra->typecodes[pos] = sa->typecodes[index];
    } else {
        ra->containers[pos] =
            container_clone(sa->containers[index], sa->typecodes[index]);
        ra->typecodes[pos] = sa->typecodes[index];
    }
    ra->size++;
}